

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void ma_preinitialize(char *caller)

{
  long lVar1;
  
  if (ma_preinitialized == '\0') {
    lVar1 = ma_set_sizes_();
    if (lVar1 == 0) {
      builtin_strncpy(ma_ebuf + 0x20,"atatypes",9);
      builtin_strncpy(ma_ebuf + 0x10,"zes of FORTRAN d",0x10);
      builtin_strncpy(ma_ebuf,"unable to set si",0x10);
      ma_error(EL_Fatal,ET_Internal,caller,ma_ebuf);
      return;
    }
    ma_preinitialized = '\x01';
  }
  return;
}

Assistant:

private void ma_preinitialize(caller)
    char    *caller;    /* name of calling routine */
{
    if (ma_preinitialized)
        return;

    /* call a FORTRAN routine to set bases and sizes of FORTRAN datatypes */
    if (ma_set_sizes_() == 0)
    {
        (void)sprintf(ma_ebuf,
            "unable to set sizes of FORTRAN datatypes");
        ma_error(EL_Fatal, ET_Internal, caller, ma_ebuf);
        return;
    }

    /* success */
    ma_preinitialized = MA_TRUE;
}